

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<std::multiset<bool,std::less<bool>,std::allocator<bool>>,void>
               (multiset<bool,_std::less<bool>,_std::allocator<bool>_> *container,ostream *os)

{
  bool bVar1;
  char8_t *pcVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var3 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(container->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var6) {
    lVar5 = 0;
    do {
      if (lVar5 == 0) {
LAB_001dcb5c:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        uVar4 = (ulong)(byte)(char)p_Var3[1]._M_color;
        pcVar2 = "some_false";
        if (uVar4 != 0) {
          pcVar2 = "some_true";
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2 + 5,uVar4 ^ 5);
        lVar5 = lVar5 + 1;
        bVar1 = true;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar5 != 0x20) goto LAB_001dcb5c;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar5 = 0x20;
        bVar1 = false;
      }
      if (!bVar1) break;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var6);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }